

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O0

void GetProjectCommandsInScriptMode(cmState *state)

{
  cmState *pcVar1;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  cmState *local_10;
  cmState *state_local;
  
  local_10 = state;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"add_compile_options",&local_31);
  cmState::AddUnexpectedCommand(state,&local_30,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"add_custom_command",&local_69);
  cmState::AddUnexpectedCommand(pcVar1,&local_68,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"add_custom_target",&local_91);
  cmState::AddUnexpectedCommand(pcVar1,&local_90,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"add_definitions",&local_b9);
  cmState::AddUnexpectedCommand(pcVar1,&local_b8,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"add_dependencies",&local_e1);
  cmState::AddUnexpectedCommand(pcVar1,&local_e0,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"add_executable",&local_109);
  cmState::AddUnexpectedCommand(pcVar1,&local_108,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"add_library",&local_131);
  cmState::AddUnexpectedCommand(pcVar1,&local_130,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"add_subdirectory",&local_159);
  cmState::AddUnexpectedCommand(pcVar1,&local_158,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"add_test",&local_181);
  cmState::AddUnexpectedCommand(pcVar1,&local_180,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"aux_source_directory",&local_1a9);
  cmState::AddUnexpectedCommand(pcVar1,&local_1a8,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"build_command",&local_1d1);
  cmState::AddUnexpectedCommand(pcVar1,&local_1d0,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"create_test_sourcelist",&local_1f9);
  cmState::AddUnexpectedCommand(pcVar1,&local_1f8,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"define_property",&local_221);
  cmState::AddUnexpectedCommand(pcVar1,&local_220,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"enable_language",&local_249);
  cmState::AddUnexpectedCommand(pcVar1,&local_248,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"enable_testing",&local_271);
  cmState::AddUnexpectedCommand(pcVar1,&local_270,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"export",&local_299);
  cmState::AddUnexpectedCommand(pcVar1,&local_298,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"fltk_wrap_ui",&local_2c1)
  ;
  cmState::AddUnexpectedCommand(pcVar1,&local_2c0,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"get_source_file_property",&local_2e9);
  cmState::AddUnexpectedCommand(pcVar1,&local_2e8,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"get_target_property",&local_311);
  cmState::AddUnexpectedCommand(pcVar1,&local_310,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"get_test_property",&local_339);
  cmState::AddUnexpectedCommand(pcVar1,&local_338,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"include_directories",&local_361);
  cmState::AddUnexpectedCommand(pcVar1,&local_360,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"include_external_msproject",&local_389);
  cmState::AddUnexpectedCommand(pcVar1,&local_388,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"include_regular_expression",&local_3b1);
  cmState::AddUnexpectedCommand(pcVar1,&local_3b0,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"install",&local_3d9);
  cmState::AddUnexpectedCommand(pcVar1,&local_3d8,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"link_directories",&local_401);
  cmState::AddUnexpectedCommand(pcVar1,&local_400,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"link_libraries",&local_429);
  cmState::AddUnexpectedCommand(pcVar1,&local_428,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"load_cache",&local_451);
  cmState::AddUnexpectedCommand(pcVar1,&local_450,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"project",&local_479);
  cmState::AddUnexpectedCommand(pcVar1,&local_478,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"qt_wrap_cpp",&local_4a1);
  cmState::AddUnexpectedCommand(pcVar1,&local_4a0,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"qt_wrap_ui",&local_4c9);
  cmState::AddUnexpectedCommand(pcVar1,&local_4c8,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"remove_definitions",&local_4f1);
  cmState::AddUnexpectedCommand(pcVar1,&local_4f0,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"set_source_files_properties",&local_519);
  cmState::AddUnexpectedCommand(pcVar1,&local_518,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"set_target_properties",&local_541);
  cmState::AddUnexpectedCommand(pcVar1,&local_540,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"set_tests_properties",&local_569);
  cmState::AddUnexpectedCommand(pcVar1,&local_568,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"source_group",&local_591)
  ;
  cmState::AddUnexpectedCommand(pcVar1,&local_590,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"target_compile_definitions",&local_5b9);
  cmState::AddUnexpectedCommand(pcVar1,&local_5b8,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"target_compile_features",&local_5e1);
  cmState::AddUnexpectedCommand(pcVar1,&local_5e0,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"target_compile_options",&local_609);
  cmState::AddUnexpectedCommand(pcVar1,&local_608,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"target_include_directories",&local_631);
  cmState::AddUnexpectedCommand(pcVar1,&local_630,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"target_link_libraries",&local_659);
  cmState::AddUnexpectedCommand(pcVar1,&local_658,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_680,"target_sources",&local_681);
  cmState::AddUnexpectedCommand(pcVar1,&local_680,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"try_compile",&local_6a9);
  cmState::AddUnexpectedCommand(pcVar1,&local_6a8,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"try_run",&local_6d1);
  cmState::AddUnexpectedCommand(pcVar1,&local_6d0,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"export_library_dependencies",&local_6f9);
  cmState::AddUnexpectedCommand(pcVar1,&local_6f8,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"load_command",&local_721)
  ;
  cmState::AddUnexpectedCommand(pcVar1,&local_720,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"output_required_files",&local_749);
  cmState::AddUnexpectedCommand(pcVar1,&local_748,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"subdir_depends",&local_771);
  cmState::AddUnexpectedCommand(pcVar1,&local_770,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"utility_source",&local_799);
  cmState::AddUnexpectedCommand(pcVar1,&local_798,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"variable_requires",&local_7c1);
  cmState::AddUnexpectedCommand(pcVar1,&local_7c0,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  return;
}

Assistant:

void GetProjectCommandsInScriptMode(cmState* state)
{
#define CM_UNEXPECTED_PROJECT_COMMAND(NAME)                                   \
  state->AddUnexpectedCommand(NAME, "command is not scriptable")

  CM_UNEXPECTED_PROJECT_COMMAND("add_compile_options");
  CM_UNEXPECTED_PROJECT_COMMAND("add_custom_command");
  CM_UNEXPECTED_PROJECT_COMMAND("add_custom_target");
  CM_UNEXPECTED_PROJECT_COMMAND("add_definitions");
  CM_UNEXPECTED_PROJECT_COMMAND("add_dependencies");
  CM_UNEXPECTED_PROJECT_COMMAND("add_executable");
  CM_UNEXPECTED_PROJECT_COMMAND("add_library");
  CM_UNEXPECTED_PROJECT_COMMAND("add_subdirectory");
  CM_UNEXPECTED_PROJECT_COMMAND("add_test");
  CM_UNEXPECTED_PROJECT_COMMAND("aux_source_directory");
  CM_UNEXPECTED_PROJECT_COMMAND("build_command");
  CM_UNEXPECTED_PROJECT_COMMAND("create_test_sourcelist");
  CM_UNEXPECTED_PROJECT_COMMAND("define_property");
  CM_UNEXPECTED_PROJECT_COMMAND("enable_language");
  CM_UNEXPECTED_PROJECT_COMMAND("enable_testing");
  CM_UNEXPECTED_PROJECT_COMMAND("export");
  CM_UNEXPECTED_PROJECT_COMMAND("fltk_wrap_ui");
  CM_UNEXPECTED_PROJECT_COMMAND("get_source_file_property");
  CM_UNEXPECTED_PROJECT_COMMAND("get_target_property");
  CM_UNEXPECTED_PROJECT_COMMAND("get_test_property");
  CM_UNEXPECTED_PROJECT_COMMAND("include_directories");
  CM_UNEXPECTED_PROJECT_COMMAND("include_external_msproject");
  CM_UNEXPECTED_PROJECT_COMMAND("include_regular_expression");
  CM_UNEXPECTED_PROJECT_COMMAND("install");
  CM_UNEXPECTED_PROJECT_COMMAND("link_directories");
  CM_UNEXPECTED_PROJECT_COMMAND("link_libraries");
  CM_UNEXPECTED_PROJECT_COMMAND("load_cache");
  CM_UNEXPECTED_PROJECT_COMMAND("project");
  CM_UNEXPECTED_PROJECT_COMMAND("qt_wrap_cpp");
  CM_UNEXPECTED_PROJECT_COMMAND("qt_wrap_ui");
  CM_UNEXPECTED_PROJECT_COMMAND("remove_definitions");
  CM_UNEXPECTED_PROJECT_COMMAND("set_source_files_properties");
  CM_UNEXPECTED_PROJECT_COMMAND("set_target_properties");
  CM_UNEXPECTED_PROJECT_COMMAND("set_tests_properties");
  CM_UNEXPECTED_PROJECT_COMMAND("source_group");
  CM_UNEXPECTED_PROJECT_COMMAND("target_compile_definitions");
  CM_UNEXPECTED_PROJECT_COMMAND("target_compile_features");
  CM_UNEXPECTED_PROJECT_COMMAND("target_compile_options");
  CM_UNEXPECTED_PROJECT_COMMAND("target_include_directories");
  CM_UNEXPECTED_PROJECT_COMMAND("target_link_libraries");
  CM_UNEXPECTED_PROJECT_COMMAND("target_sources");
  CM_UNEXPECTED_PROJECT_COMMAND("try_compile");
  CM_UNEXPECTED_PROJECT_COMMAND("try_run");

  // deprecated commands
  CM_UNEXPECTED_PROJECT_COMMAND("export_library_dependencies");
  CM_UNEXPECTED_PROJECT_COMMAND("load_command");
  CM_UNEXPECTED_PROJECT_COMMAND("output_required_files");
  CM_UNEXPECTED_PROJECT_COMMAND("subdir_depends");
  CM_UNEXPECTED_PROJECT_COMMAND("utility_source");
  CM_UNEXPECTED_PROJECT_COMMAND("variable_requires");

#undef CM_UNEXPECTED_PROJECT_COMMAND
}